

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,_4U>::yflip(ImageT<unsigned_int,_4U> *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  void *__dest;
  int iVar4;
  Color *__src;
  Color *__src_00;
  
  uVar3 = (this->super_Image).width;
  __n = (ulong)(uVar3 << 4);
  __dest = operator_new__((ulong)uVar3 << 4);
  iVar4 = 0;
  uVar3 = (this->super_Image).height;
  uVar2 = uVar3;
  while (uVar2 = uVar2 - 1, uVar3 >> 1 <= uVar2) {
    uVar1 = (this->super_Image).width;
    __src_00 = this->pixels + uVar1 * uVar2;
    __src = this->pixels + uVar1 * iVar4;
    memcpy(__dest,__src,__n);
    memcpy(__src,__src_00,__n);
    memcpy(__src_00,__dest,__n);
    iVar4 = iVar4 + 1;
    uVar3 = (this->super_Image).height;
  }
  operator_delete__(__dest);
  return this;
}

Assistant:

virtual ImageT& yflip() override {
        uint32_t rowSize = width * sizeof(Color);
        // Minimize memory use by only buffering a single row.
        Color* rowBuffer = new Color[width];

        for (uint32_t sy = height-1, dy = 0; sy >= height / 2; sy--, dy++) {
            Color* srcRow = &pixels[width * sy];
            Color* dstRow = &pixels[width * dy];

            memcpy(rowBuffer, dstRow, rowSize);
            memcpy(dstRow, srcRow, rowSize);
            memcpy(srcRow, rowBuffer, rowSize);
        }
        delete[] rowBuffer;
        return *this;
    }